

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

void RDL_deleteData(RDL_data *data)

{
  uint i;
  ulong uVar1;
  
  uVar1 = 0;
  while( true ) {
    if (data->bccGraphs->nof_bcc <= uVar1) break;
    RDL_deleteAPSP(data->spiPerBCC[uVar1],data->bccGraphs->bcc_graphs[uVar1]->V);
    RDL_deleteCycleFams(data->CFsPerBCC[uVar1]);
    if (data->nofURFsPerBCC[uVar1] != 0) {
      RDL_deleteURFInfo(data->urfInfoPerBCC[uVar1]);
    }
    uVar1 = uVar1 + 1;
  }
  free(data->spiPerBCC);
  free(data->CFsPerBCC);
  free(data->nofURFsPerBCC);
  free(data->nofRCFsPerBCC);
  free(data->urfInfoPerBCC);
  RDL_deleteBCCGraph(data->bccGraphs);
  free(data->urf_to_bcc);
  free(data->rcf_to_urf);
  RDL_deleteGraph(data->graph);
  free(data);
  return;
}

Assistant:

void RDL_deleteData(RDL_data *data)
{
  unsigned i;

  for (i = 0; i < data->bccGraphs->nof_bcc; ++i) {
    RDL_deleteAPSP(data->spiPerBCC[i], data->bccGraphs->bcc_graphs[i]->V);
    RDL_deleteCycleFams(data->CFsPerBCC[i]);
    if (data->nofURFsPerBCC[i] > 0) {
      RDL_deleteURFInfo(data->urfInfoPerBCC[i]);
    }
  }
  free(data->spiPerBCC);
  free(data->CFsPerBCC);
  free(data->nofURFsPerBCC);
  free(data->nofRCFsPerBCC);
  free(data->urfInfoPerBCC);
  RDL_deleteBCCGraph(data->bccGraphs);
  free(data->urf_to_bcc);
  free(data->rcf_to_urf);

  RDL_deleteGraph(data->graph);
  free(data);
}